

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O3

void kv_set_var_nentry_update_test(void)

{
  long *plVar1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  long lVar3;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  bnode *__ptr;
  size_t sVar10;
  ushort *puVar11;
  undefined2 *puVar12;
  btree_kv_ops *pbVar13;
  undefined8 *puVar14;
  size_t i;
  bnode *pbVar15;
  undefined8 *puVar16;
  char *pcVar17;
  undefined8 *puVar18;
  bool bVar19;
  undefined8 *puVar20;
  long lVar21;
  bnode *pbVar22;
  void *pvVar23;
  char cVar24;
  char *__s;
  ulong uVar25;
  undefined1 auStack_4d7 [310];
  char acStack_3a1 [383];
  char acStack_222 [170];
  undefined8 local_178 [5];
  undefined8 local_150;
  undefined8 auStack_148 [6];
  btree_kv_ops local_118;
  undefined1 local_98 [8];
  timeval __test_begin;
  char *keys [6];
  undefined1 local_31 [8];
  uint8_t v;
  
  puVar16 = auStack_148;
  lVar21 = 0;
  local_150 = 0x103090;
  gettimeofday((timeval *)local_98,(__timezone_ptr_t)0x0);
  local_150 = 0x103095;
  memleak_start();
  __test_begin.tv_usec = (long)"longstring" + 4;
  local_150 = 0x1030c0;
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0x901;
  __ptr->flag = 0;
  __ptr->level = 1;
  __ptr->nentry = 6;
  (__ptr->field_4).data = __ptr + 1;
  local_31[0] = 100;
  local_150 = 0x1030ec;
  btree_str_kv_get_kb64_vb64(&local_118);
  pcVar17 = (char *)0x0;
  pbVar15 = (bnode *)0x0;
  do {
    __s = *(char **)((long)keys + lVar21 + -8);
    local_150 = 0x1030fe;
    sVar10 = strlen(__s);
    uVar7 = (int)sVar10 + 1;
    puVar20 = (undefined8 *)(ulong)(uVar7 & 0xffff);
    local_150 = 0x103120;
    puVar11 = (ushort *)malloc((size_t)((long)puVar20 + 2));
    uVar6 = (ushort)uVar7;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    local_150 = 0x10313d;
    memcpy(puVar11 + 1,__s,(size_t)puVar20);
    *(undefined8 *)((long)auStack_148 + lVar21) = puVar11;
    local_150 = 0x103159;
    (*local_118.set_kv)(__ptr,(idx_t)pcVar17,(undefined8 *)((long)auStack_148 + lVar21),local_31);
    local_150 = 0x10316d;
    iVar8 = strcmp((char *)((long)(__ptr->field_4).data + (long)pbVar15 + 2),__s);
    if (iVar8 != 0) {
      local_150 = 0x103378;
      kv_set_var_nentry_update_test();
      pbVar22 = __ptr;
      goto LAB_00103378;
    }
    local_150 = 0x10317d;
    sVar10 = strlen(__s);
    pbVar15 = (bnode *)((long)&pbVar15->level + sVar10);
    pcVar17 = (char *)(ulong)((int)pcVar17 + 1);
    lVar21 = lVar21 + 8;
  } while (lVar21 != 0x30);
  lVar21 = 0;
  do {
    local_150 = 0x1031a8;
    free((void *)auStack_148[lVar21]);
    lVar21 = lVar21 + 1;
  } while (lVar21 != 6);
  puVar16 = local_178;
  pbVar22 = (bnode *)0x0;
  uVar7 = 0;
  puVar20 = (undefined8 *)0x0;
  do {
    pcVar17 = *(char **)((long)&__test_begin.tv_usec + (long)pbVar22);
    sVar10 = strlen(pcVar17);
    uVar9 = (int)sVar10 + 1;
    uVar25 = (ulong)(uVar9 & 0xffff);
    puVar11 = (ushort *)malloc(uVar25 + 2);
    uVar6 = (ushort)uVar9;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    __s = (char *)(ulong)uVar7;
    memcpy(puVar11 + 1,pcVar17,uVar25);
    *(ushort **)((long)puVar16 + (long)pbVar22) = puVar11;
    (*local_118.set_kv)(__ptr,(idx_t)uVar7,(undefined1 *)((long)puVar16 + (long)pbVar22),local_31);
    iVar8 = strcmp((undefined1 *)((long)(__ptr->field_4).data + (long)puVar20) + 2,pcVar17);
    pbVar15 = __ptr;
    if (iVar8 != 0) goto LAB_00103378;
    sVar10 = strlen(pcVar17);
    puVar20 = (undefined8 *)((long)puVar20 + sVar10 + 4);
    uVar7 = uVar7 + 1;
    pbVar22 = (bnode *)&pbVar22->field_4;
  } while (pbVar22 != (bnode *)0x30);
  (*local_118.set_kv)(__ptr,3,puVar16,local_31);
  pbVar22 = (bnode *)0x0;
  (*local_118.set_kv)(__ptr,0,&local_150,local_31);
  __test_begin.tv_usec = (__suseconds_t)anon_var_dwarf_f95;
  (*local_118.set_kv)(__ptr,5,puVar16,local_31);
  pbVar15 = (bnode *)((__ptr->field_4).dummy + 2);
  pcVar17 = (char *)0x0;
  while( true ) {
    __s = keys[(long)&pbVar22[-1].field_4.data + 7];
    iVar8 = strcmp(pcVar17 + (long)&pbVar15->kvsize,__s);
    puVar20 = puVar16;
    if (iVar8 != 0) break;
    sVar10 = strlen(__s);
    pcVar17 = pcVar17 + sVar10 + 4;
    pbVar22 = (bnode *)((long)&pbVar22->kvsize + 1);
    if (pbVar22 == (bnode *)0x6) {
      free(__ptr);
      lVar21 = 0;
      do {
        free((void *)puVar16[lVar21]);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 6);
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (kv_set_var_nentry_update_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar17,"kv_set_var_nentry_update_test");
      return;
    }
  }
LAB_0010337d:
  puVar16[-1] = kv_get_var_test;
  kv_set_var_nentry_update_test();
  puVar16[-1] = &stack0xfffffffffffffff8;
  puVar16[-2] = __s;
  puVar16[-3] = pbVar22;
  puVar16[-4] = puVar20;
  puVar16[-5] = pcVar17;
  puVar16[-6] = pbVar15;
  puVar16[-0x10] = 0x10339c;
  gettimeofday((timeval *)(puVar16 + -8),(__timezone_ptr_t)0x0);
  puVar16[-0x10] = 0x1033a1;
  memleak_start();
  puVar16[-0x10] = 0x1033ab;
  puVar12 = (undefined2 *)malloc(0xd);
  *puVar12 = 0xb00;
  *(undefined8 *)(puVar12 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar12 + 9) = 0x676e69;
  pcVar17 = "teststring";
  puVar20 = puVar16 + -0xc;
  *puVar20 = puVar12;
  puVar16[-0x10] = 0x1033df;
  pbVar15 = (bnode *)malloc(0x1010);
  pbVar15->kvsize = 0xd08;
  pbVar15->flag = 0;
  pbVar15->level = 1;
  pbVar15->nentry = 0;
  (pbVar15->field_4).data = pbVar15 + 1;
  puVar18 = puVar16 + -0xe;
  *puVar18 = 0x14;
  plVar1 = puVar16 + -0xd;
  *plVar1 = 0;
  puVar16[-0x10] = 0x103418;
  pbVar13 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var2 = pbVar13->set_kv;
  puVar16[-0x10] = 0x103429;
  (*p_Var2)(pbVar15,0,puVar20,puVar18);
  p_Var2 = pbVar13->get_kv;
  puVar16[-0x10] = 0x103437;
  (*p_Var2)(pbVar15,0,plVar1,puVar16 + -0xf);
  puVar16[-0x10] = 0x103447;
  iVar8 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar8 == 0) {
    if (puVar16[-0xf] != puVar16[-0xe]) goto LAB_00103552;
    pcVar17 = (char *)(puVar16 + -0xd);
    p_Var2 = pbVar13->get_kv;
    puVar16[-0x10] = 0x103471;
    (*p_Var2)(pbVar15,0,pcVar17,puVar16 + -0xf);
    puVar16[-0x10] = 0x103484;
    iVar8 = strcmp((char *)(*(long *)pcVar17 + 2),"teststring");
    if (iVar8 != 0) goto LAB_00103557;
    if (puVar16[-0xf] != puVar16[-0xe]) goto LAB_0010355c;
    p_Var2 = pbVar13->get_kv;
    puVar16[-0x10] = 0x1034ad;
    (*p_Var2)(pbVar15,0,puVar16 + -0xd,(void *)0x0);
    pcVar17 = (char *)puVar16[-0xd];
    puVar16[-0x10] = 0x1034c0;
    iVar8 = strcmp((char *)((long)pcVar17 + 2),"teststring");
    if (iVar8 != 0) goto LAB_00103561;
    if (puVar16[-0xf] == puVar16[-0xe]) {
      puVar16[-0x10] = 0x1034df;
      free(pbVar15);
      puVar16[-0xb] = pbVar13;
      puVar16[-10] = puVar16[-0xc];
      puVar16[-9] = pcVar17;
      lVar21 = 0;
      do {
        pvVar23 = (void *)puVar16[lVar21 + -0xb];
        puVar16[-0x10] = 0x1034ff;
        free(pvVar23);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      puVar16[-0x10] = 0x10350d;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (kv_get_var_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      puVar16[-0x10] = 0x10353e;
      fprintf(_stderr,pcVar17,"kv_get_var_test");
      return;
    }
  }
  else {
    puVar16[-0x10] = 0x103552;
    kv_get_var_test();
LAB_00103552:
    puVar16[-0x10] = 0x103557;
    kv_get_var_test();
LAB_00103557:
    puVar16[-0x10] = 0x10355c;
    kv_get_var_test();
LAB_0010355c:
    puVar16[-0x10] = 0x103561;
    kv_get_var_test();
LAB_00103561:
    puVar16[-0x10] = 0x103566;
    kv_get_var_test();
  }
  puVar16[-0x10] = kv_get_var_nentry_test;
  kv_get_var_test();
  puVar16[-0x10] = plVar1;
  puVar16[-0x11] = pcVar17;
  puVar16[-0x12] = pbVar13;
  puVar16[-0x13] = puVar18;
  puVar16[-0x14] = puVar20;
  puVar16[-0x15] = pbVar15;
  lVar21 = 0;
  puVar16[-0x23] = 0x10358d;
  gettimeofday((timeval *)(puVar16 + -0x22),(__timezone_ptr_t)0x0);
  puVar16[-0x23] = 0x103592;
  memleak_start();
  puVar16[-0x17] = 0;
  puVar20 = &DAT_00109d70;
  do {
    pcVar17 = *(char **)((long)&DAT_00109d70 + lVar21);
    puVar16[-0x23] = 0x1035ad;
    sVar10 = strlen(pcVar17);
    uVar7 = (int)sVar10 + 1;
    uVar25 = (ulong)(uVar7 & 0xffff);
    puVar16[-0x23] = 0x1035bc;
    puVar11 = (ushort *)malloc(uVar25 + 2);
    uVar6 = (ushort)uVar7;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    puVar16[-0x23] = 0x1035d9;
    memcpy(puVar11 + 1,pcVar17,uVar25);
    *(ushort **)((long)puVar16 + lVar21 + -0x100) = puVar11;
    lVar21 = lVar21 + 8;
  } while (lVar21 != 0x30);
  puVar16[-0x23] = 0x1035f2;
  pbVar15 = (bnode *)malloc(0x1010);
  pbVar15->kvsize = 0x901;
  pbVar15->flag = 0;
  pbVar15->level = 1;
  pbVar15->nentry = 6;
  (pbVar15->field_4).data = pbVar15 + 1;
  *(undefined1 *)((long)puVar16 + -0xa9) = 100;
  pbVar13 = (btree_kv_ops *)(puVar16 + -0x32);
  puVar16[-0x33] = 0x103623;
  btree_str_kv_get_kb64_vb64(pbVar13);
  puVar18 = puVar16 + -0x20;
  uVar25 = 0;
  do {
    puVar16[-0x33] = 0x10363c;
    (*(code *)puVar16[-0x31])(pbVar15,uVar25 & 0xffff,puVar18,(undefined1 *)((long)puVar16 + -0xa9))
    ;
    *(char *)((long)puVar16 + -0xa9) = *(char *)((long)puVar16 + -0xa9) + '\x01';
    uVar25 = uVar25 + 1;
    puVar18 = puVar18 + 1;
  } while (uVar25 != 6);
  *(undefined1 *)((long)puVar16 + -0xa9) = 100;
  lVar21 = 0;
  while( true ) {
    p_Var2 = pbVar13->get_kv;
    puVar16[-0x33] = 0x103665;
    (*p_Var2)(pbVar15,(idx_t)lVar21,puVar16 + -0x17,(undefined1 *)((long)puVar16 + -0xaa));
    lVar3 = puVar16[-0x17];
    pcVar17 = (char *)*puVar20;
    puVar16[-0x33] = 0x103677;
    iVar8 = strcmp((char *)(lVar3 + 2),pcVar17);
    if (iVar8 != 0) break;
    if (*(char *)((long)puVar16 + -0xaa) != *(char *)((long)puVar16 + -0xa9)) {
      puVar16[-0x33] = 0x103719;
      kv_get_var_nentry_test();
      break;
    }
    *(char *)((long)puVar16 + -0xa9) = *(char *)((long)puVar16 + -0xaa) + '\x01';
    lVar21 = lVar21 + 1;
    puVar20 = puVar20 + 1;
    if (lVar21 == 6) {
      puVar16[-0x1a] = pbVar15;
      puVar16[-0x19] = lVar3;
      lVar21 = 0;
      do {
        pvVar23 = (void *)puVar16[lVar21 + -0x1a];
        puVar16[-0x33] = 0x1036b1;
        free(pvVar23);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 2);
      lVar21 = 0;
      do {
        pvVar23 = (void *)puVar16[lVar21 + -0x20];
        puVar16[-0x33] = 0x1036c6;
        free(pvVar23);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 6);
      puVar16[-0x33] = 0x1036d4;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      puVar16[-0x33] = 0x103705;
      fprintf(_stderr,pcVar17,"kv_get_var_nentry_test");
      return;
    }
  }
  puVar16[-0x33] = kv_ins_var;
  kv_get_var_nentry_test();
  puVar16[-0x33] = puVar16 + -0x10;
  puVar16[-0x34] = lVar21;
  puVar16[-0x35] = pbVar13;
  puVar16[-0x36] = puVar20;
  puVar16[-0x37] = lVar3;
  puVar16[-0x38] = pbVar15;
  puVar16[-0x40] = 0x103738;
  gettimeofday((timeval *)(puVar16 + -0x3a),(__timezone_ptr_t)0x0);
  puVar16[-0x40] = 0x10373d;
  memleak_start();
  puVar16[-0x40] = 0x103747;
  puVar12 = (undefined2 *)malloc(0xd);
  *puVar12 = 0xb00;
  *(undefined8 *)(puVar12 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar12 + 9) = 0x676e69;
  puVar20 = puVar16 + -0x3b;
  *puVar20 = puVar12;
  puVar16[-0x40] = 0x10377b;
  pbVar15 = (bnode *)malloc(0x1010);
  pbVar15->kvsize = 0xd08;
  pbVar15->flag = 0;
  pbVar15->level = 1;
  pbVar15->nentry = 0;
  (pbVar15->field_4).data = pbVar15 + 1;
  puVar18 = puVar16 + -0x3d;
  *puVar18 = 0x14;
  plVar1 = puVar16 + -0x3c;
  *plVar1 = 0;
  puVar16[-0x40] = 0x1037b4;
  pbVar13 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var2 = pbVar13->ins_kv;
  puVar16[-0x40] = 0x1037c5;
  (*p_Var2)(pbVar15,0,puVar20,puVar18);
  p_Var2 = pbVar13->get_kv;
  puVar16[-0x40] = 0x1037d5;
  (*p_Var2)(pbVar15,0,plVar1,puVar16 + -0x3e);
  puVar16[-0x40] = 0x1037e5;
  iVar8 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar8 == 0) {
    if (puVar16[-0x3e] == puVar16[-0x3d]) {
      puVar16[-0x40] = 0x1037fd;
      free(pbVar15);
      puVar16[-0x40] = 0x103805;
      free(pbVar13);
      puVar16[-0x40] = 0x10380f;
      free((void *)puVar16[-0x3b]);
      puVar16[-0x40] = 0x103819;
      free((void *)puVar16[-0x3c]);
      puVar16[-0x40] = 0x10381e;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (kv_ins_var()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      puVar16[-0x40] = 0x10384f;
      fprintf(_stderr,pcVar17,"kv_ins_var");
      return;
    }
  }
  else {
    puVar16[-0x40] = 0x103863;
    kv_ins_var();
  }
  puVar16[-0x40] = kv_ins_var_nentry_test;
  kv_ins_var();
  puVar16[-0x40] = plVar1;
  puVar16[-0x41] = pbVar13;
  puVar16[-0x42] = "teststring";
  puVar16[-0x43] = puVar18;
  puVar16[-0x44] = puVar20;
  puVar16[-0x45] = pbVar15;
  puVar18 = puVar16 + -0x4a;
  lVar21 = 0;
  puVar16[-0x4b] = 0x103886;
  gettimeofday((timeval *)(puVar16 + -0x4a),(__timezone_ptr_t)0x0);
  puVar16[-0x4b] = 0x10388b;
  memleak_start();
  puVar20 = puVar16 + -0x48;
  bVar5 = true;
  do {
    bVar19 = bVar5;
    pcVar17 = (char *)(&DAT_00109d60)[lVar21];
    puVar16[-0x4b] = 0x1038a5;
    sVar10 = strlen(pcVar17);
    uVar7 = (int)sVar10 + 1;
    uVar25 = (ulong)(uVar7 & 0xffff);
    puVar16[-0x4b] = 0x1038b4;
    puVar11 = (ushort *)malloc(uVar25 + 2);
    uVar6 = (ushort)uVar7;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    puVar16[-0x4b] = 0x1038d1;
    memcpy(puVar11 + 1,pcVar17,uVar25);
    *puVar20 = puVar11;
    lVar21 = 1;
    puVar20 = puVar16 + -0x47;
    bVar5 = false;
  } while (bVar19);
  puVar16[-0x4b] = 0x1038f4;
  puVar14 = (undefined8 *)malloc(0x1010);
  *puVar14 = 0x2000100000901;
  puVar14[1] = puVar14 + 2;
  pcVar17 = (char *)((long)puVar16 + -0x229);
  *pcVar17 = 'd';
  puVar16[-0x5b] = 0x103923;
  btree_str_kv_get_kb64_vb64((btree_kv_ops *)(puVar16 + -0x5a));
  puVar16[-0x5b] = 0x103933;
  (*(code *)puVar16[-0x58])(puVar14,0,puVar16 + -0x48,pcVar17);
  *pcVar17 = *pcVar17 + '\x01';
  puVar16[-0x5b] = 0x103946;
  (*(code *)puVar16[-0x58])(puVar14,0,puVar16 + -0x47,pcVar17);
  lVar21 = puVar14[1];
  puVar16[-0x5b] = 0x10395a;
  iVar8 = strcmp((char *)(lVar21 + 2),"longstring");
  if (iVar8 == 0) {
    cVar24 = *(char *)(lVar21 + 0xd);
    puVar18 = (undefined8 *)CONCAT71((int7)((ulong)(puVar16 + -0x4a) >> 8),cVar24);
    if (cVar24 != *(char *)((long)puVar16 + -0x229)) goto LAB_001039b1;
    cVar24 = cVar24 + -1;
    puVar18 = (undefined8 *)CONCAT71((int7)((ulong)(puVar16 + -0x4a) >> 8),cVar24);
    *(char *)((long)puVar16 + -0x229) = cVar24;
    puVar16[-0x5b] = 0x10397f;
    iVar8 = strcmp((char *)(lVar21 + 0x10),"string");
    if (iVar8 == 0) {
      if (*(char *)(lVar21 + 0x17) == cVar24) {
        puVar16[-0x5b] = 0x10399d;
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_001039bb;
    }
  }
  else {
    puVar16[-0x5b] = 0x1039b1;
    kv_ins_var_nentry_test();
LAB_001039b1:
    puVar16[-0x5b] = 0x1039b6;
    kv_ins_var_nentry_test();
  }
  puVar16[-0x5b] = 0x1039bb;
  kv_ins_var_nentry_test();
LAB_001039bb:
  puVar16[-0x5b] = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  puVar16[-0x5b] = puVar18;
  puVar16[-0x5c] = lVar21;
  puVar16[-0x5d] = puVar14;
  puVar16[-0x62] = 0x1039d5;
  gettimeofday((timeval *)(puVar16 + -0x5f),(__timezone_ptr_t)0x0);
  puVar16[-0x62] = 0x1039da;
  memleak_start();
  puVar16[-0x61] = 0;
  puVar16[-0x62] = 0x1039eb;
  pbVar13 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  puVar16[-0x62] = 0x1039f8;
  puVar12 = (undefined2 *)malloc(0xd);
  *puVar12 = 0xb00;
  *(undefined8 *)(puVar12 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar12 + 9) = 0x676e69;
  pcVar17 = "teststring";
  puVar16[-0x60] = puVar12;
  p_Var4 = pbVar13->set_key;
  puVar16[-0x62] = 0x103a29;
  (*p_Var4)((btree *)0x0,puVar16 + -0x61,puVar16 + -0x60);
  pvVar23 = (void *)puVar16[-0x61];
  puVar16[-0x62] = 0x103a38;
  iVar8 = strcmp((char *)((long)pvVar23 + 2),"teststring");
  if (iVar8 == 0) {
    puVar16[-0x62] = 0x103a48;
    free(pvVar23);
    puVar16[-0x62] = 0x103a52;
    puVar12 = (undefined2 *)malloc(0x15);
    *puVar12 = 0x1300;
    pcVar17 = (char *)(puVar12 + 1);
    pcVar17[0] = 'u';
    pcVar17[1] = 'p';
    pcVar17[2] = 'd';
    pcVar17[3] = 'a';
    pcVar17[4] = 't';
    pcVar17[5] = 'e';
    pcVar17[6] = 'd';
    pcVar17[7] = ' ';
    pcVar17 = (char *)(puVar12 + 5);
    pcVar17[0] = 't';
    pcVar17[1] = 'e';
    pcVar17[2] = 's';
    pcVar17[3] = 't';
    pcVar17[4] = 's';
    pcVar17[5] = 't';
    pcVar17[6] = 'r';
    pcVar17[7] = 'i';
    *(undefined4 *)((long)puVar12 + 0x11) = 0x676e69;
    pcVar17 = "updated teststring";
    puVar16[-0x61] = puVar12;
    p_Var4 = pbVar13->set_key;
    puVar16[-0x62] = 0x103a83;
    (*p_Var4)((btree *)0x0,puVar16 + -0x60,puVar16 + -0x61);
    pvVar23 = (void *)puVar16[-0x60];
    puVar16[-0x62] = 0x103a92;
    iVar8 = strcmp((char *)((long)pvVar23 + 2),"updated teststring");
    if (iVar8 == 0) {
      puVar16[-0x62] = 0x103a9e;
      free(pbVar13);
      puVar16[-0x62] = 0x103aa6;
      free(pvVar23);
      puVar16[-0x62] = 0x103aaf;
      free((void *)puVar16[-0x61]);
      puVar16[-0x62] = 0x103ab4;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (kv_set_str_key_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      puVar16[-0x62] = 0x103ae5;
      fprintf(_stderr,pcVar17,"kv_set_str_key_test");
      return;
    }
  }
  else {
    puVar16[-0x62] = 0x103af4;
    kv_set_str_key_test();
  }
  puVar16[-0x62] = kv_set_str_value_test;
  kv_set_str_key_test();
  puVar16[-0x62] = pcVar17;
  puVar16[-99] = pvVar23;
  puVar16[-100] = puVar20;
  puVar16[-0x65] = pbVar13;
  puVar16[-0x71] = 0x103b10;
  gettimeofday((timeval *)(puVar16 + -0x6e),(__timezone_ptr_t)0x0);
  puVar16[-0x71] = 0x103b15;
  memleak_start();
  puVar16[-0x70] = 100;
  *(undefined1 *)((long)puVar16 + -0x35f) = 8;
  puVar16[-0x71] = 0x103b30;
  pbVar13 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var4 = pbVar13->set_value;
  puVar16[-0x71] = 0x103b44;
  (*p_Var4)((btree *)(puVar16 + -0x6c),puVar16 + -0x70,puVar16 + -0x6f);
  if (puVar16[-0x70] != puVar16[-0x6f]) {
    puVar16[-0x71] = 0x103b5a;
    kv_set_str_value_test();
  }
  plVar1 = puVar16 + -0x6f;
  *plVar1 = 200;
  p_Var4 = pbVar13->set_value;
  puVar16[-0x71] = 0x103b77;
  (*p_Var4)((btree *)(puVar16 + -0x6c),plVar1,puVar16 + -0x70);
  if (puVar16[-0x70] != *plVar1) {
    puVar16[-0x71] = 0x103b8c;
    kv_set_str_value_test();
  }
  puVar16[-0x71] = 0x103b94;
  free(pbVar13);
  puVar16[-0x71] = 0x103b99;
  memleak_end();
  pcVar17 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar17 = "%s FAILED\n";
  }
  puVar16[-0x71] = 0x103bca;
  fprintf(_stderr,pcVar17,"kv_set_str_value_test");
  return;
LAB_00103378:
  puVar16[-1] = 0x10337d;
  kv_set_var_nentry_update_test();
  goto LAB_0010337d;
}

Assistant:

void kv_set_var_nentry_update_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    int cmp, i;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string WITH space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    size_t offset_idx = 0;

    // first pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    freevars(key_ptrs, n);
    key_ptrs = alca(void *, n);
    offset_idx = 0;

    // second pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    /* swap entries */

    // copy first key to middle
    kv_ops->set_kv(node, n/2, &key_ptrs[0], (void *)&v);
    keys[n/2] = keys[0];

    // copy last key to first
    kv_ops->set_kv(node, 0, &key_ptrs[n-1], (void *)&v);
    keys[0] = keys[n - 1];

    // copy middle key to last
    kv_ops->set_kv(node, n - 1, &key_ptrs[0], (void *)&v);
    keys[n - 1] = keys[n/2];

    // verify
    offset_idx = 0;
    for (i = 0; i < n; i++) {
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    free(node);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}